

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

void * tclpkcs11_int_load_module(char *pathname)

{
  void *pvVar1;
  char *pathname_local;
  
  pvVar1 = (void *)dlopen(pathname,2);
  return pvVar1;
}

Assistant:

MODULE_SCOPE void *tclpkcs11_int_load_module(const char *pathname) {
  #if defined(TCL_INCLUDES_LOADFILE)
  int tcl_rv;
  Tcl_LoadHandle *new_handle;

  new_handle = (Tcl_LoadHandle *) ckalloc(sizeof(*new_handle));

  tcl_rv = Tcl_LoadFile(NULL, Tcl_NewStringObj(pathname, -1), NULL, 0, NULL, new_handle);
  if (tcl_rv != TCL_OK) {
    return(NULL);
  }

  return(new_handle);
  #elif defined(HAVE_DLOPEN)
  /*LISSI*/
  //fprintf (stderr, "tclpkcs11_int_load_module=%s\n", pathname);
  return(dlopen(pathname, RTLD_NOW /*| RTLD_GLOBAL*/));
  /*	return(dlopen(pathname, RTLD_NOW | RTLD_GLOBAL));*/
  	
  #elif defined(HAVE_SHL_LOAD)
  return(shl_load(pathname, BIND_DEFERRED, 0L));
  #elif defined(_WIN32)
  /*LISSI*/
  char cp1251[2048];
  memset(cp1251, '\0', 2048);
  utf8_to_win1251((const char*) pathname, cp1251);

  return(LoadLibraryA(cp1251));
  //	return(LoadLibrary(pathname));
  #endif
  return(NULL);
}